

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::processAllTriangles::MyNodeOverlapCallback::MyNodeOverlapCallback
          (MyNodeOverlapCallback *this,btTriangleCallback *callback,
          btStridingMeshInterface *meshInterface)

{
  _func_int **in_RDX;
  _func_int **in_RSI;
  btNodeOverlapCallback *in_RDI;
  btVector3 *local_30;
  
  btNodeOverlapCallback::btNodeOverlapCallback(in_RDI);
  in_RDI->_vptr_btNodeOverlapCallback = (_func_int **)&PTR__MyNodeOverlapCallback_002e3e88;
  in_RDI[1]._vptr_btNodeOverlapCallback = in_RDX;
  in_RDI[2]._vptr_btNodeOverlapCallback = in_RSI;
  local_30 = (btVector3 *)(in_RDI + 3);
  do {
    btVector3::btVector3(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (btVector3 *)(in_RDI + 9));
  return;
}

Assistant:

MyNodeOverlapCallback(btTriangleCallback* callback,btStridingMeshInterface* meshInterface)
			:m_meshInterface(meshInterface),
			m_callback(callback)
		{
		}